

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_to_dfa.cpp
# Opt level: O2

SyntaxTreeNode * __thiscall
RegexToDFAConverter::expression_eval(RegexToDFAConverter *this,string *expr,int *curr_pos)

{
  int iVar1;
  bool bVar2;
  SyntaxTreeNode *this_00;
  SyntaxTreeNode *pSVar3;
  __node_base *p_Var4;
  int it;
  SyntaxTreeNode *son;
  value_type local_4c;
  SyntaxTreeNode *local_48;
  int *local_40;
  RegexToDFAConverter *local_38;
  
  this_00 = (SyntaxTreeNode *)operator_new(0x90);
  SyntaxTreeNode::SyntaxTreeNode(this_00);
  local_40 = curr_pos;
  local_38 = this;
  pSVar3 = term_eval(this,expr,curr_pos);
  local_48 = pSVar3;
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=(&(this_00->first_pos)._M_h,&(pSVar3->first_pos)._M_h);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=(&(this_00->last_pos)._M_h,&(pSVar3->last_pos)._M_h);
  std::
  vector<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
  ::push_back((vector<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
               *)this_00,&local_48);
  this_00->nullable = local_48->nullable;
  while( true ) {
    iVar1 = *local_40;
    if (((int)expr->_M_string_length <= iVar1) || ((expr->_M_dataplus)._M_p[iVar1] != '|')) break;
    *local_40 = iVar1 + 1;
    local_48 = term_eval(local_38,expr,local_40);
    std::
    vector<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
    ::push_back((vector<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                 *)this_00,&local_48);
    bVar2 = true;
    if (this_00->nullable == false) {
      bVar2 = local_48->nullable;
    }
    this_00->nullable = bVar2;
    p_Var4 = &(local_48->first_pos)._M_h._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      local_4c = (value_type)*(size_type *)(p_Var4 + 1);
      std::__detail::
      _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this_00->first_pos,&local_4c);
    }
    p_Var4 = &(local_48->last_pos)._M_h._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      local_4c = (value_type)*(size_type *)(p_Var4 + 1);
      std::__detail::
      _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this_00->last_pos,&local_4c);
    }
  }
  SyntaxTreeNode::wipe_sons(this_00);
  return this_00;
}

Assistant:

RegexToDFAConverter::SyntaxTreeNode* RegexToDFAConverter::expression_eval(
    const string &expr, int &curr_pos) {

  SyntaxTreeNode* root = new SyntaxTreeNode;
  auto son = term_eval(expr, curr_pos);
  root->first_pos = son->first_pos;
  root->last_pos = son->last_pos;
  root->sons.push_back(son);
  root->nullable = son->nullable;

  while (curr_pos < (int)expr.size() && expr[curr_pos] == '|') {
    son = term_eval(expr, ++curr_pos);
    root->sons.push_back(son);
    root->nullable = (root->nullable || son->nullable);
    for (int it : son->first_pos)
      root->first_pos.insert(it);
    for (int it : son->last_pos)
      root->last_pos.insert(it);
  }

  root->wipe_sons();
  return root;
}